

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O2

void duckdb::ConstantFillFunctionValidity
               (ColumnSegment *segment,Vector *result,idx_t start_idx,idx_t count)

{
  bool bVar1;
  
  bVar1 = BaseStatistics::CanHaveNull(&(segment->stats).statistics);
  if (bVar1) {
    FlatVector::VerifyFlatVector(result);
    while (bVar1 = count != 0, count = count - 1, bVar1) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,start_idx);
      start_idx = start_idx + 1;
    }
  }
  return;
}

Assistant:

void ConstantFillFunctionValidity(ColumnSegment &segment, Vector &result, idx_t start_idx, idx_t count) {
	auto &stats = segment.stats.statistics;
	if (stats.CanHaveNull()) {
		auto &mask = FlatVector::Validity(result);
		for (idx_t i = 0; i < count; i++) {
			mask.SetInvalid(start_idx + i);
		}
	}
}